

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O2

void cvui::render::text(cvui_block_t *theBlock,String *theText,Point *thePos,double theFontScale,
                       uint theColor)

{
  Point local_60;
  undefined4 local_58 [2];
  cvui_block_t *local_50;
  undefined8 local_48;
  Scalar local_40;
  
  local_48 = 0;
  local_58[0] = 0x3010000;
  local_60 = *thePos;
  local_50 = theBlock;
  internal::hexToScalar(&local_40,theColor);
  cv::putText(theFontScale,local_58,theText,&local_60,0,&local_40,1,0x10,0);
  return;
}

Assistant:

void text(cvui_block_t& theBlock, const cv::String& theText, cv::Point& thePos, double theFontScale, unsigned int theColor) {
		cv::putText(theBlock.where, theText, thePos, cv::FONT_HERSHEY_SIMPLEX, theFontScale, internal::hexToScalar(theColor), 1, CVUI_ANTIALISED);
	}